

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Status_f2c(MPIABI_Fint *f_status,MPIABI_Status *c_status)

{
  int iVar1;
  MPI_Status *pMVar2;
  WPI_StatusPtr local_20;
  MPIABI_Status *local_18;
  MPIABI_Status *c_status_local;
  MPIABI_Fint *f_status_local;
  
  local_18 = c_status;
  c_status_local = (MPIABI_Status *)f_status;
  WPI_StatusPtr::WPI_StatusPtr(&local_20,c_status);
  pMVar2 = WPI_StatusPtr::operator_cast_to_ompi_status_public_t_(&local_20);
  iVar1 = MPI_Status_f2c(f_status,pMVar2);
  WPI_StatusPtr::~WPI_StatusPtr(&local_20);
  return iVar1;
}

Assistant:

int MPIABI_Status_f2c(
  const MPIABI_Fint * f_status,
  MPIABI_Status * c_status
) {
  return MPI_Status_f2c(
    (const MPI_Fint *)(const WPI_Fint *)f_status,
    (MPI_Status *)(WPI_StatusPtr)c_status
  );
}